

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O1

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::bulk_load
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          V *values,int num_keys)

{
  int iVar1;
  AlexNode<int,_int> *pAVar2;
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  undefined8 in_XMM3_Qb;
  DataNodeStats stats;
  LinearModel<int> root_data_node_model;
  DataNodeStats local_48;
  LinearModel<int> local_38;
  
  if ((0 < num_keys) && ((this->stats_).num_keys < 1)) {
    delete_node(this,this->root_node_);
    (this->stats_).num_keys = num_keys;
    pAVar2 = (AlexNode<int,_int> *)operator_new(0x40);
    pAVar2->is_leaf_ = false;
    pAVar2->duplication_factor_ = '\0';
    pAVar2->level_ = 0;
    (pAVar2->model_).a_ = 0.0;
    (pAVar2->model_).b_ = 0.0;
    pAVar2->cost_ = 0.0;
    pAVar2->_vptr_AlexNode = (_func_int **)&PTR__AlexModelNode_00116cd8;
    pAVar2[1]._vptr_AlexNode = (_func_int **)&this->field_0xbd;
    pAVar2[1].is_leaf_ = false;
    pAVar2[1].duplication_factor_ = '\0';
    pAVar2[1].level_ = 0;
    pAVar2[1].model_.a_ = 0.0;
    this->root_node_ = pAVar2;
    iVar1 = values->first;
    dVar4 = 1.0 / (double)(values[(ulong)(uint)num_keys - 1].first - iVar1);
    (pAVar2->model_).a_ = dVar4;
    auVar5._0_8_ = (double)iVar1;
    auVar5._8_8_ = in_XMM3_Qb;
    auVar3._8_8_ = 0x8000000000000000;
    auVar3._0_8_ = 0x8000000000000000;
    auVar3 = vxorpd_avx512vl(auVar5,auVar3);
    (pAVar2->model_).b_ = dVar4 * auVar3._0_8_;
    local_38.a_ = 0.0;
    local_38.b_ = 0.0;
    AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
    build_model(values,num_keys,&local_38,(this->params_).approximate_model_computation);
    local_48.num_search_iterations = 0.0;
    local_48.num_shifts = 0.0;
    dVar4 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
            compute_expected_cost
                      (values,num_keys,0.7,(this->params_).expected_insert_frac,&local_38,
                       (this->params_).approximate_cost_computation,&local_48);
    this->root_node_->cost_ = dVar4;
    bulk_load_node(this,values,num_keys,&this->root_node_,num_keys,&local_38);
    pAVar2 = this->root_node_;
    if (pAVar2->is_leaf_ == true) {
      pAVar2[4].model_.b_ = local_48.num_search_iterations;
      pAVar2[4].cost_ = local_48.num_shifts;
    }
    create_superroot(this);
    update_superroot_key_domain(this);
    link_all_data_nodes(this);
  }
  return;
}

Assistant:

void bulk_load(const V values[], int num_keys) {
    if (stats_.num_keys > 0 || num_keys <= 0) {
      return;
    }
    delete_node(root_node_);  // delete the empty root node from constructor

    stats_.num_keys = num_keys;

    // Build temporary root model, which outputs a CDF in the range [0, 1]
    root_node_ =
        new (model_node_allocator().allocate(1)) model_node_type(0, allocator_);
    T min_key = values[0].first;
    T max_key = values[num_keys - 1].first;
    root_node_->model_.a_ = 1.0 / (max_key - min_key);
    root_node_->model_.b_ = -1.0 * min_key * root_node_->model_.a_;

    // Compute cost of root node
    LinearModel<T> root_data_node_model;
    data_node_type::build_model(values, num_keys, &root_data_node_model,
                                params_.approximate_model_computation);
    DataNodeStats stats;
    root_node_->cost_ = data_node_type::compute_expected_cost(
        values, num_keys, data_node_type::kInitDensity_,
        params_.expected_insert_frac, &root_data_node_model,
        params_.approximate_cost_computation, &stats);

    // Recursively bulk load
    bulk_load_node(values, num_keys, root_node_, num_keys,
                   &root_data_node_model);

    if (root_node_->is_leaf_) {
      static_cast<data_node_type*>(root_node_)
          ->expected_avg_exp_search_iterations_ = stats.num_search_iterations;
      static_cast<data_node_type*>(root_node_)->expected_avg_shifts_ =
          stats.num_shifts;
    }

    create_superroot();
    update_superroot_key_domain();
    link_all_data_nodes();
  }